

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall Hospital::Validate_username_password(Hospital *this,string *user,string *pass)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  bVar1 = std::operator!=(user,&this->Admin_Username);
  if (bVar1) {
    pcVar3 = "your Username or Password is incorrect !!! ";
    bVar1 = false;
  }
  else {
    bVar1 = std::operator!=(pass,&this->Admin_Password);
    pcVar3 = "You entered successfully ...";
    if (bVar1) {
      pcVar3 = "your Username or Password is incorrect !!! ";
    }
    bVar1 = !bVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return bVar1;
}

Assistant:

bool Hospital ::Validate_username_password(string user , string pass){
    if ((user != Admin_Username) || (pass != Admin_Password)){
        cout << "your Username or Password is incorrect !!! "<<endl;
        return false;
    }
    else {
        cout << "You entered successfully ..." << endl;
        return true;
    }
}